

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O2

void __thiscall CfgNode::BlockData::addInstruction(BlockData *this,Instruction *instr)

{
  _List_node_base *p_Var1;
  uint __line;
  int iVar2;
  char *__assertion;
  Instruction *instr_local;
  
  instr_local = instr;
  if ((instr == (Instruction *)0x0) || (instr->m_size < 1)) {
    __assertion = "instr != 0 && instr->size() > 0";
    __line = 0x69;
  }
  else if ((this->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>._M_impl.
           _M_node.super__List_node_base._M_next == (_List_node_base *)&this->m_instrs) {
    if (instr->m_addr == (this->super_Data).m_addr) goto LAB_0010530d;
    __assertion = "instr->addr() == m_addr";
    __line = 0x6c;
  }
  else {
    p_Var1 = (this->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>.
             _M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
    if (instr->m_addr == (long)&p_Var1->_M_prev->_M_next + (long)*(int *)&p_Var1[1]._M_next) {
LAB_0010530d:
      std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::push_back
                (&this->m_instrs,&instr_local);
      iVar2 = ((int)instr_local->m_addr + instr_local->m_size) - (int)(this->super_Data).m_addr;
      if (this->m_size < iVar2) {
        this->m_size = iVar2;
      }
      return;
    }
    __assertion = "instr->addr() == (prev->addr() + prev->size())";
    __line = 0x70;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                ,__line,"void CfgNode::BlockData::addInstruction(Instruction *)");
}

Assistant:

void CfgNode::BlockData::addInstruction(Instruction* instr) {
	assert(instr != 0 && instr->size() > 0);

	if (m_instrs.empty()) {
		assert(instr->addr() == m_addr);
		m_instrs.push_back(instr);
	} else {
		Instruction* prev = m_instrs.back();
		assert(instr->addr() == (prev->addr() + prev->size()));
		m_instrs.push_back(instr);
	}

	int size = (instr->addr() + instr->size()) - m_addr;
	if (size > m_size)
		m_size = size;
}